

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::addCollisionObject
          (btCollisionWorld *this,btCollisionObject *collisionObject,short collisionFilterGroup,
          short collisionFilterMask)

{
  btCollisionObject *this_00;
  uint uVar1;
  int iVar2;
  btCollisionShape *pbVar3;
  btBroadphaseInterface *pbVar4;
  undefined4 extraout_var;
  short in_CX;
  short in_DX;
  btCollisionObject *in_RSI;
  btCollisionWorld *in_RDI;
  int type;
  btVector3 maxAabb;
  btVector3 minAabb;
  btTransform trans;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  btTransform *in_stack_ffffffffffffff60;
  btCollisionObject **in_stack_ffffffffffffff68;
  btVector3 local_7c;
  btVector3 local_6c;
  undefined1 local_5c [64];
  short local_1c;
  short local_1a;
  btCollisionObject *local_18;
  
  local_1c = in_CX;
  local_1a = in_DX;
  local_18 = in_RSI;
  btAlignedObjectArray<btCollisionObject_*>::push_back
            ((btAlignedObjectArray<btCollisionObject_*> *)in_RDI,in_stack_ffffffffffffff68);
  btCollisionObject::getWorldTransform(local_18);
  btTransform::btTransform
            (in_stack_ffffffffffffff60,
             (btTransform *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  btVector3::btVector3(&local_6c);
  btVector3::btVector3(&local_7c);
  pbVar3 = btCollisionObject::getCollisionShape(local_18);
  (*pbVar3->_vptr_btCollisionShape[2])(pbVar3,local_5c,&local_6c,&local_7c);
  pbVar3 = btCollisionObject::getCollisionShape(local_18);
  uVar1 = btCollisionShape::getShapeType(pbVar3);
  this_00 = local_18;
  pbVar4 = getBroadphase(in_RDI);
  iVar2 = (*pbVar4->_vptr_btBroadphaseInterface[2])
                    (pbVar4,&local_6c,&local_7c,(ulong)uVar1,local_18,(ulong)(uint)(int)local_1a,
                     (int)local_1c,in_RDI->m_dispatcher1,0);
  btCollisionObject::setBroadphaseHandle(this_00,(btBroadphaseProxy *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

void	btCollisionWorld::addCollisionObject(btCollisionObject* collisionObject,short int collisionFilterGroup,short int collisionFilterMask)
{

	btAssert(collisionObject);

	//check that the object isn't already added
	btAssert( m_collisionObjects.findLinearSearch(collisionObject)  == m_collisionObjects.size());

	m_collisionObjects.push_back(collisionObject);

	//calculate new AABB
	btTransform trans = collisionObject->getWorldTransform();

	btVector3	minAabb;
	btVector3	maxAabb;
	collisionObject->getCollisionShape()->getAabb(trans,minAabb,maxAabb);

	int type = collisionObject->getCollisionShape()->getShapeType();
	collisionObject->setBroadphaseHandle( getBroadphase()->createProxy(
		minAabb,
		maxAabb,
		type,
		collisionObject,
		collisionFilterGroup,
		collisionFilterMask,
		m_dispatcher1,0
		))	;





}